

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int test_mp_read_typed(void)

{
  mp_type mVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined1 *puVar5;
  double dVar6;
  ulong uVar7;
  bool is_ok;
  bool is_ok_00;
  bool is_ok_01;
  bool is_ok_02;
  bool is_ok_03;
  bool is_ok_04;
  bool is_ok_05;
  bool is_ok_06;
  bool is_ok_07;
  bool is_ok_08;
  bool is_ok_09;
  bool is_ok_10;
  bool is_ok_11;
  bool is_ok_12;
  bool is_ok_13;
  bool is_ok_14;
  bool is_ok_15;
  bool is_ok_16;
  bool is_ok_17;
  bool is_ok_18;
  bool is_ok_19;
  bool is_ok_20;
  bool is_ok_21;
  bool is_ok_22;
  bool is_ok_23;
  bool is_ok_24;
  bool is_ok_25;
  bool is_ok_26;
  bool is_ok_27;
  bool is_ok_28;
  bool is_ok_29;
  bool is_ok_30;
  bool is_ok_31;
  bool is_ok_32;
  bool is_ok_33;
  bool is_ok_34;
  bool is_ok_35;
  bool is_ok_36;
  bool is_ok_37;
  float fVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  char *pcVar15;
  undefined1 uVar16;
  uint uVar17;
  char *pcVar18;
  _func_int_char_ptr_ptr_int_ptr *read_f;
  _func_int_char_ptr_ptr_long_ptr *read_f_00;
  char (*mp_nums_00) [16];
  byte bVar19;
  int i_1;
  long lVar20;
  char *pcVar21;
  int i;
  char *pcVar22;
  bool bVar23;
  float num1;
  float num1_00;
  double num1_01;
  double num1_02;
  char mp_nums [16] [16];
  char str [256];
  byte *pbStack_2a8;
  char *pcStack_2a0;
  byte *pbStack_298;
  char *pcStack_290;
  byte *pbStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  code *pcStack_270;
  uint8_t local_261;
  byte *local_260;
  mp_type local_254;
  byte *local_250;
  byte local_248;
  undefined8 local_247;
  byte local_23f [7];
  undefined1 local_238;
  undefined8 local_237;
  undefined1 local_228;
  undefined2 local_227;
  undefined1 local_225;
  undefined1 local_218;
  undefined2 local_208;
  undefined1 local_206;
  undefined2 uStack_205;
  undefined1 uStack_203;
  undefined4 local_1f8;
  undefined1 local_1f4;
  undefined1 local_1e8;
  long local_148;
  byte *local_140;
  char local_138 [256];
  byte local_38 [8];
  
  pcStack_270 = (code *)0x12c1c6;
  _plan(0x2cc,true);
  pcStack_270 = (code *)0x12c1d5;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12c1ea;
  printf("# *** %s ***\n","test_mp_read_typed");
  pcStack_270 = (code *)0x12c1f9;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok);
  pcStack_270 = (code *)0x12c208;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x7f,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_00);
  pcStack_270 = (code *)0x12c214;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (0x80,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_01);
  pcStack_270 = (code *)0x12c223;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0xc,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_02);
  pcStack_270 = (code *)0x12c232;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x80,(_func_int_char_ptr_ptr_char_ptr *)0x1,is_ok_03);
  pcStack_270 = (code *)0x12c23e;
  test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
            (-0x81,(_func_int_char_ptr_ptr_char_ptr *)0x0,is_ok_04);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_270 = (code *)0x12c28b;
  iVar3 = snprintf(local_138 + 0xe,0xf2,"%f",0xbf33a92a40000000);
  pcVar18 = local_138 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x12c2af;
  iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_270 = (code *)0x12c2ce;
  snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",8);
  pcStack_270 = (code *)0x12c2d6;
  _space((FILE *)_stdout);
  lVar14 = 1;
  pcStack_270 = (code *)0x12c2f4;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12c304;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12c311;
  fputc(10,_stdout);
  pbVar11 = &local_248;
  local_248 = 0xca;
  local_247._0_4_ = 0x52499db9;
  local_238 = 0xcb;
  local_237 = 0x402aa933bf;
  lVar20 = 0;
  do {
    bVar19 = *pbVar11;
    uVar9 = (ulong)bVar19;
    mVar1 = mp_type_hint[uVar9];
    if (mVar1 == MP_UINT) {
      switch(bVar19) {
      case 0xcc:
        uVar9 = (ulong)pbVar11[1];
        break;
      case 0xcd:
        uVar9 = (ulong)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
        break;
      case 0xce:
        uVar4 = *(uint *)(pbVar11 + 1);
        uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18);
        break;
      case 0xcf:
        uVar9 = *(ulong *)(pbVar11 + 1);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        break;
      default:
        if ((char)bVar19 < '\0') goto LAB_0012e586;
      }
      if (uVar9 != 0) goto LAB_0012e625;
    }
    else if (mVar1 == MP_FLOAT) {
      if (bVar19 != 0xca) goto LAB_0012e6b8;
      uVar4 = *(uint *)(pbVar11 + 1);
      fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      if ((fVar8 != -0.0003) || (NAN(fVar8))) goto LAB_0012e61b;
    }
    else if (mVar1 == MP_INT) {
      switch(bVar19) {
      case 0xd0:
        uVar9 = (ulong)(char)pbVar11[1];
        break;
      case 0xd1:
        uVar9 = (ulong)(short)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
        break;
      case 0xd2:
        uVar4 = *(uint *)(pbVar11 + 1);
        uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
        break;
      case 0xd3:
        uVar9 = *(ulong *)(pbVar11 + 1);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        break;
      default:
        uVar9 = 1;
        if (bVar19 < 0xe0) goto LAB_0012e58b;
      }
      if (uVar9 != 0) goto LAB_0012e620;
    }
    else {
      if (bVar19 != 0xcb) goto LAB_0012e5ae;
      uVar9 = *(ulong *)(pbVar11 + 1);
      dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                       (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                       (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
      if ((dVar6 != -0.0003000000142492354) || (NAN(dVar6))) goto LAB_0012e616;
    }
    lVar10 = lVar20 * 0x10;
    switch(bVar19) {
    case 0xcc:
      uVar9 = (ulong)pbVar11[1];
      pbVar13 = pbVar11 + 2;
      break;
    case 0xcd:
      pbVar13 = local_23f + lVar10 + -6;
      uVar9 = (ulong)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
      break;
    case 0xce:
      uVar4 = *(uint *)(pbVar11 + 1);
      uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      pbVar13 = local_23f + lVar10 + -4;
      break;
    case 0xcf:
      uVar9 = *(ulong *)(pbVar11 + 1);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar13 = local_23f + lVar10;
      break;
    case 0xd0:
      pbVar13 = pbVar11 + 2;
      goto LAB_0012c522;
    case 0xd1:
      pbVar13 = pbVar11 + 3;
      uVar9 = (ulong)(short)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
      goto LAB_0012c510;
    case 0xd2:
      uVar4 = *(uint *)(pbVar11 + 1);
      pbVar13 = local_23f + lVar10 + -4;
      uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18);
      goto LAB_0012c510;
    case 0xd3:
      uVar9 = *(ulong *)(pbVar11 + 1);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar13 = local_23f + lVar10;
LAB_0012c510:
      if ((long)(char)uVar9 == uVar9) goto LAB_0012c522;
      goto LAB_0012c57d;
    default:
      if (-0x21 < (char)bVar19) {
        pbVar13 = local_23f + lVar10 + -8;
        goto LAB_0012c522;
      }
      goto LAB_0012c57d;
    }
    if (uVar9 < 0x80) {
LAB_0012c522:
      iVar3 = 0;
    }
    else {
LAB_0012c57d:
      iVar3 = 1;
      pbVar13 = pbVar11;
    }
    pcStack_270 = (code *)0x12c545;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
    pcStack_270 = (code *)0x12c56b;
    _ok((uint)(pbVar11 == pbVar13),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    lVar20 = lVar20 + 1;
    pbVar11 = pbVar11 + 0x10;
    lVar14 = lVar14 + -1;
  } while (lVar14 == 0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_270 = (code *)0x12c5c6;
  iVar3 = snprintf(local_138 + 0xe,0xf2,"%lf",0x405edccccccccccd);
  pcVar18 = local_138 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x12c5f2;
  iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_270 = (code *)0x12c611;
  snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",8);
  pcStack_270 = (code *)0x12c620;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12c639;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12c649;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12c656;
  fputc(10,_stdout);
  pcStack_270 = (code *)0x12c6ad;
  _ok(1,"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x737,
      "check failure for code 0x%02X",0xffffffcb);
  pcStack_270 = (code *)0x12c6cf;
  _ok(1,"mp_num_pos2 == mp_nums[i]",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x738,
      "check position");
  builtin_strncpy(local_138 + 0x13,"eading ",8);
  builtin_strncpy(local_138,"ensure failure of r",0x13);
  pcStack_270 = (code *)0x12c705;
  snprintf(local_138 + 0x1a,0xe6,"int%zu_t",8);
  pcStack_270 = (code *)0x12c714;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12c72d;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12c73d;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12c74a;
  fputc(10,_stdout);
  local_248 = 0x91;
  local_238 = 0x81;
  local_228 = 0xa3;
  local_227 = 0x6261;
  local_225 = 99;
  local_218 = 0xc3;
  local_254 = MP_DOUBLE;
  local_261 = '\0';
  local_208 = 0x3c7;
  local_208 = 0x3c7;
  local_206 = 1;
  uStack_203 = 99;
  uStack_205 = 0x6261;
  pbVar11 = &local_248;
  local_1f8 = 0x626103c4;
  local_1f4 = 99;
  local_1e8 = 0xc0;
  lVar20 = 7;
  lVar14 = 0;
  do {
    lVar10 = lVar14 * 0x10;
    bVar19 = *pbVar11;
    switch(bVar19) {
    case 0xcc:
      uVar9 = (ulong)pbVar11[1];
      pbVar13 = pbVar11 + 2;
      break;
    case 0xcd:
      pbVar13 = local_23f + lVar10 + -6;
      uVar9 = (ulong)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
      break;
    case 0xce:
      uVar4 = *(uint *)(pbVar11 + 1);
      uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      pbVar13 = local_23f + lVar10 + -4;
      break;
    case 0xcf:
      uVar9 = *(ulong *)(pbVar11 + 1);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar13 = local_23f + lVar10;
      break;
    case 0xd0:
      pbVar13 = pbVar11 + 2;
      goto LAB_0012c87d;
    case 0xd1:
      pbVar13 = pbVar11 + 3;
      uVar9 = (ulong)(short)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
      goto LAB_0012c866;
    case 0xd2:
      uVar4 = *(uint *)(pbVar11 + 1);
      pbVar13 = local_23f + lVar10 + -4;
      uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18);
      goto LAB_0012c866;
    case 0xd3:
      uVar9 = *(ulong *)(pbVar11 + 1);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar13 = local_23f + lVar10;
LAB_0012c866:
      if ((long)(char)uVar9 == uVar9) goto LAB_0012c87d;
      goto LAB_0012c8dd;
    default:
      if (-0x21 < (char)bVar19) {
        pbVar13 = local_23f + lVar10 + -8;
        goto LAB_0012c87d;
      }
      goto LAB_0012c8dd;
    }
    if (uVar9 < 0x80) {
LAB_0012c87d:
      iVar3 = 0;
    }
    else {
LAB_0012c8dd:
      iVar3 = 1;
      pbVar13 = pbVar11;
    }
    pcStack_270 = (code *)0x12c8a2;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
    pcStack_270 = (code *)0x12c8cb;
    _ok((uint)(pbVar11 == pbVar13),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
    lVar14 = lVar14 + 1;
    pbVar11 = pbVar11 + 0x10;
    lVar20 = lVar20 + -1;
  } while (lVar20 != 0);
  pcStack_270 = (code *)0x12c8f6;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_05);
  pcStack_270 = (code *)0x12c905;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x7fff,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_06);
  pcStack_270 = (code *)0x12c911;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_07);
  pcStack_270 = (code *)0x12c920;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x7b,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_08);
  pcStack_270 = (code *)0x12c92f;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8000,(_func_int_char_ptr_ptr_short_ptr *)0x1,is_ok_09);
  pcStack_270 = (code *)0x12c93b;
  test_read_num<short,int,int(*)(char_const**,short*)>
            (-0x8001,(_func_int_char_ptr_ptr_short_ptr *)0x0,is_ok_10);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_270 = (code *)0x12c97a;
  iVar3 = snprintf(local_138 + 0xe,0xf2,"%f",0xbf60624de0000000);
  pcVar18 = local_138 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x12c9a6;
  iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_270 = (code *)0x12c9c5;
  snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",0x10);
  pcStack_270 = (code *)0x12c9d4;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12c9ed;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12c9fd;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12ca0a;
  fputc(10,_stdout);
  local_248 = 0xca;
  local_247._0_4_ = 0x6f1203bb;
  local_238 = 0xcb;
  local_237 = 0xe04d6260bf;
  lVar14 = 0;
  lVar20 = 0;
  do {
    bVar19 = (&local_248)[lVar14];
    uVar9 = (ulong)bVar19;
    mVar1 = mp_type_hint[uVar9];
    if (mVar1 == MP_UINT) {
      switch(bVar19) {
      case 0xcc:
        uVar9 = (ulong)local_23f[lVar14 + -8];
        break;
      case 0xcd:
        uVar9 = (ulong)(ushort)(*(ushort *)(local_23f + lVar14 + -8) << 8 |
                               *(ushort *)(local_23f + lVar14 + -8) >> 8);
        break;
      case 0xce:
        uVar4 = *(uint *)(local_23f + lVar14 + -8);
        uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18);
        break;
      case 0xcf:
        uVar9 = *(ulong *)(local_23f + lVar14 + -8);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        break;
      default:
        if ((char)bVar19 < '\0') goto LAB_0012e590;
      }
      if (uVar9 != 0) goto LAB_0012e639;
    }
    else if (mVar1 == MP_FLOAT) {
      if (bVar19 != 0xca) goto LAB_0012e6b8;
      uVar4 = *(uint *)(local_23f + lVar14 + -8);
      fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      if ((fVar8 != -0.002) || (NAN(fVar8))) goto LAB_0012e62f;
    }
    else if (mVar1 == MP_INT) {
      switch(bVar19) {
      case 0xd0:
        uVar9 = (ulong)(char)local_23f[lVar14 + -8];
        break;
      case 0xd1:
        uVar9 = (ulong)(short)(*(ushort *)(local_23f + lVar14 + -8) << 8 |
                              *(ushort *)(local_23f + lVar14 + -8) >> 8);
        break;
      case 0xd2:
        uVar4 = *(uint *)(local_23f + lVar14 + -8);
        uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
        break;
      case 0xd3:
        uVar9 = *(ulong *)(local_23f + lVar14 + -8);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        break;
      default:
        uVar9 = 1;
        if (bVar19 < 0xe0) goto LAB_0012e595;
      }
      if (uVar9 != 0) goto LAB_0012e634;
    }
    else {
      if (bVar19 != 0xcb) goto LAB_0012e5ae;
      uVar9 = *(ulong *)(local_23f + lVar14 + -8);
      dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                       (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                       (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
      if ((dVar6 != -0.0020000000949949026) || (NAN(dVar6))) goto LAB_0012e62a;
    }
    lVar10 = lVar20 * 0x10;
    switch(bVar19) {
    case 0xcc:
      pbVar11 = local_23f + lVar10 + -7;
      break;
    case 0xcd:
      pbVar11 = local_23f + lVar14 + -6;
      uVar9 = (ulong)(ushort)(*(ushort *)(local_23f + lVar14 + -8) << 8 |
                             *(ushort *)(local_23f + lVar14 + -8) >> 8);
      goto LAB_0012cc00;
    case 0xce:
      uVar4 = *(uint *)(local_23f + lVar14 + -8);
      uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      pbVar11 = local_23f + lVar10 + -4;
      goto LAB_0012cc00;
    case 0xcf:
      uVar9 = *(ulong *)(local_23f + lVar14 + -8);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar11 = local_23f + lVar10;
LAB_0012cc00:
      if (uVar9 < 0x8000) break;
LAB_0012cc94:
      iVar3 = 1;
      pbVar11 = &local_248 + lVar14;
      goto LAB_0012cc3a;
    case 0xd0:
      pbVar11 = local_23f + lVar14 + -7;
      break;
    case 0xd1:
      pbVar11 = local_23f + lVar10 + -6;
      break;
    case 0xd2:
      pbVar11 = local_23f + lVar14 + -4;
      uVar4 = *(uint *)(local_23f + lVar14 + -8);
      uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18);
      goto LAB_0012cc26;
    case 0xd3:
      uVar9 = *(ulong *)(local_23f + lVar14 + -8);
      uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      pbVar11 = local_23f + lVar10;
LAB_0012cc26:
      if ((long)(short)uVar9 == uVar9) break;
      goto LAB_0012cc94;
    default:
      if (-0x21 < (char)bVar19) {
        pbVar11 = local_23f + lVar10 + -8;
        break;
      }
      goto LAB_0012cc94;
    }
    iVar3 = 0;
LAB_0012cc3a:
    pcStack_270 = (code *)0x12cc5b;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
    pcStack_270 = (code *)0x12cc81;
    _ok((uint)(&local_248 + lVar14 == pbVar11),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    lVar20 = lVar20 + 1;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 == 0x10);
  builtin_strncpy(local_138 + 0xb,"of ",4);
  builtin_strncpy(local_138,"typed read ",0xb);
  pcStack_270 = (code *)0x12ccdd;
  iVar3 = snprintf(local_138 + 0xe,0xf2,"%lf",0x4028b0a3d70a3d71);
  pcVar18 = local_138 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x12cd09;
  iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_270 = (code *)0x12cd28;
  snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",0x10);
  pcStack_270 = (code *)0x12cd37;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12cd50;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12cd60;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12cd6d;
  fputc(10,_stdout);
  if (local_254 != MP_UINT) {
    if (local_254 == MP_FLOAT) goto LAB_0012e6b8;
    if (local_254 == MP_INT) goto LAB_0012e694;
    pcStack_270 = (code *)0x12cdbb;
    _ok(1,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",0xffffffcb);
    pcStack_270 = (code *)0x12cddd;
    _ok(1,"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    builtin_strncpy(local_138 + 0x13,"eading ",8);
    builtin_strncpy(local_138,"ensure failure of r",0x13);
    pcStack_270 = (code *)0x12ce13;
    snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x10);
    pcStack_270 = (code *)0x12ce22;
    _space((FILE *)_stdout);
    pcStack_270 = (code *)0x12ce3b;
    fwrite("# ",2,1,_stdout);
    pcStack_270 = (code *)0x12ce4b;
    fputs(local_138,_stdout);
    pcStack_270 = (code *)0x12ce58;
    fputc(10,_stdout);
    local_248 = 0x91;
    local_238 = 0x81;
    local_228 = 0xa3;
    local_227 = 0x6261;
    local_225 = 99;
    local_218 = 0xc3;
    if (local_261 == '\0') {
      puVar5 = &local_206;
      local_208 = 0x3c7;
    }
    else {
      puVar5 = (undefined1 *)((long)&local_208 + 1);
      local_208 = CONCAT11(local_208._1_1_,local_261);
    }
    *puVar5 = 1;
    puVar5[3] = 99;
    *(undefined2 *)(puVar5 + 1) = 0x6261;
    local_1f8 = 0x626103c4;
    local_1f4 = 99;
    local_1e8 = 0xc0;
    lVar20 = 0;
    lVar14 = 0;
    do {
      lVar10 = lVar14 * 0x10;
      pbVar11 = &local_248 + lVar20;
      bVar19 = *pbVar11;
      switch(bVar19) {
      case 0xcc:
        pbVar13 = local_23f + lVar10 + -7;
        break;
      case 0xcd:
        pbVar13 = local_23f + lVar20 + -6;
        uVar9 = (ulong)(ushort)(*(ushort *)(local_23f + lVar20 + -8) << 8 |
                               *(ushort *)(local_23f + lVar20 + -8) >> 8);
        goto LAB_0012cf48;
      case 0xce:
        uVar4 = *(uint *)(local_23f + lVar20 + -8);
        uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18);
        pbVar13 = local_23f + lVar10 + -4;
        goto LAB_0012cf48;
      case 0xcf:
        uVar9 = *(ulong *)(local_23f + lVar20 + -8);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        pbVar13 = local_23f + lVar10;
LAB_0012cf48:
        if (uVar9 < 0x8000) break;
LAB_0012cfe5:
        iVar3 = 1;
        pbVar13 = pbVar11;
        goto LAB_0012cf86;
      case 0xd0:
        pbVar13 = local_23f + lVar20 + -7;
        break;
      case 0xd1:
        pbVar13 = local_23f + lVar10 + -6;
        break;
      case 0xd2:
        pbVar13 = local_23f + lVar20 + -4;
        uVar4 = *(uint *)(local_23f + lVar20 + -8);
        uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
        goto LAB_0012cf6d;
      case 0xd3:
        uVar9 = *(ulong *)(local_23f + lVar20 + -8);
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        pbVar13 = local_23f + lVar10;
LAB_0012cf6d:
        if ((long)(short)uVar9 == uVar9) break;
        goto LAB_0012cfe5;
      default:
        if (-0x21 < (char)bVar19) {
          pbVar13 = local_23f + lVar10 + -8;
          break;
        }
        goto LAB_0012cfe5;
      }
      iVar3 = 0;
LAB_0012cf86:
      pcStack_270 = (code *)0x12cfa9;
      _ok(iVar3,"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
      pcVar18 = "pos == bad_types[i]";
      pcStack_270 = (code *)0x12cfd2;
      _ok((uint)(pbVar11 == pbVar13),"pos == bad_types[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
      lVar14 = lVar14 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x70);
    pcStack_270 = (code *)0x12d003;
    test_read_num<int,int,int(*)(char_const**,int*)>
              (0x7b,(_func_int_char_ptr_ptr_int_ptr *)pcVar18,is_ok_11);
    pcStack_270 = (code *)0x12d00d;
    test_read_num<int,int,int(*)(char_const**,int*)>
              (0x3039,(_func_int_char_ptr_ptr_int_ptr *)pcVar18,is_ok_12);
    pcStack_270 = (code *)0x12d017;
    test_read_num<int,int,int(*)(char_const**,int*)>
              (0x7fffffff,(_func_int_char_ptr_ptr_int_ptr *)pcVar18,is_ok_13);
    read_f = (_func_int_char_ptr_ptr_int_ptr *)0x0;
    pcStack_270 = (code *)0x12d023;
    test_read_num<int,long,int(*)(char_const**,int*)>
              (0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x0,is_ok_14);
    pcStack_270 = (code *)0x12d02d;
    test_read_num<int,int,int(*)(char_const**,int*)>(-0x7b,read_f,is_ok_15);
    pcStack_270 = (code *)0x12d037;
    test_read_num<int,int,int(*)(char_const**,int*)>(-0x3039,read_f,is_ok_16);
    pcStack_270 = (code *)0x12d048;
    test_read_num<int,long,int(*)(char_const**,int*)>
              (-0x80000000,(_func_int_char_ptr_ptr_int_ptr *)0x1,is_ok_17);
    builtin_strncpy(local_138 + 0xb,"of ",4);
    builtin_strncpy(local_138,"typed read ",0xb);
    pcStack_270 = (code *)0x12d089;
    iVar3 = snprintf(local_138 + 0xe,0xf2,"%lld",0xffffffff7fffffff);
    pcVar22 = local_138 + (long)iVar3 + 0xe;
    pcVar18 = (char *)local_38;
    pcStack_270 = (code *)0x12d0b5;
    iVar3 = snprintf(pcVar22,(long)pcVar18 - (long)pcVar22," into ");
    pcStack_270 = (code *)0x12d0d4;
    snprintf(pcVar22 + iVar3,(long)pcVar18 - (long)(pcVar22 + iVar3),"int%zu_t",0x20);
    pcStack_270 = (code *)0x12d0e3;
    _space((FILE *)_stdout);
    pcStack_270 = (code *)0x12d0fc;
    fwrite("# ",2,1,_stdout);
    pcStack_270 = (code *)0x12d10c;
    fputs(local_138,_stdout);
    pcStack_270 = (code *)0x12d119;
    fputc(10,_stdout);
    mp_nums_00 = (char (*) [16])&local_248;
    pcStack_270 = (code *)0x12d126;
    uVar4 = test_encode_int_all_sizes(mp_nums_00,-0x80000001);
    if (0 < (int)uVar4) {
      pcVar15 = (char *)(ulong)uVar4;
      pbVar11 = (byte *)((long)&local_247 + 1);
      pcVar22 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      pcVar21 = (char *)0x0;
      do {
        bVar19 = pbVar11[-2];
        iVar3 = (int)((ulong)(uint)(int)(char)bVar19 & 0xff);
        mVar1 = mp_type_hint[(ulong)(uint)(int)(char)bVar19 & 0xff];
        if (mVar1 == MP_UINT) {
          if (bVar19 == 0xcf) {
            if (*(long *)(pbVar11 + -1) == -0x8000000001) goto LAB_0012d1f1;
          }
          else if ((2 < bVar19 - 0xcc) && ((char)bVar19 < '\0')) goto LAB_0012e6e1;
          pcStack_270 = (code *)0x12e5e9;
          test_mp_read_typed();
          iVar3 = extraout_EAX;
LAB_0012e5e9:
          if ((2 < iVar3 - 0xd0U) && (bVar19 < 0xe0)) goto LAB_0012e6e6;
LAB_0012e5fd:
          pcStack_270 = (code *)0x12e602;
          test_mp_read_typed();
          goto LAB_0012e602;
        }
        if (mVar1 == MP_FLOAT) {
          if (bVar19 != 0xca) goto LAB_0012e6b8;
          uVar4 = *(uint *)(pbVar11 + -1);
          fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                         uVar4 << 0x18);
          if ((fVar8 != -2.1474836e+09) || (NAN(fVar8))) goto LAB_0012e652;
        }
        else if (mVar1 == MP_INT) {
          if (iVar3 != 0xd3) goto LAB_0012e5e9;
          if (*(long *)(pbVar11 + -1) != -0x8000000001) goto LAB_0012e5fd;
        }
        else {
          if (bVar19 != 0xcb) goto LAB_0012e5ae;
          uVar9 = *(ulong *)(pbVar11 + -1);
          dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                           (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                           (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                           (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
          if ((dVar6 != -2147483649.0) || (NAN(dVar6))) goto LAB_0012e657;
        }
LAB_0012d1f1:
        lVar14 = (long)pcVar21 * 0x10;
        pcVar18 = (char *)(pbVar11 + -2);
        switch(bVar19) {
        case 0xcc:
          pbVar13 = local_23f + lVar14 + -7;
          break;
        case 0xcd:
        case 0xd1:
          pbVar13 = local_23f + lVar14 + -6;
          break;
        case 0xce:
          uVar4 = *(uint *)(pbVar11 + -1);
          uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                         uVar4 << 0x18);
          pbVar13 = pbVar11 + 3;
          goto LAB_0012d26f;
        case 0xcf:
          uVar9 = *(ulong *)(pbVar11 + -1);
          uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38;
          pbVar13 = local_23f + lVar14;
LAB_0012d26f:
          if (uVar9 < 0x80000000) break;
LAB_0012d2df:
          iVar3 = 1;
          pbVar13 = (byte *)pcVar18;
          goto LAB_0012d28a;
        case 0xd0:
          pbVar13 = pbVar11;
          break;
        case 0xd2:
          pbVar13 = local_23f + lVar14 + -4;
          break;
        case 0xd3:
          uVar9 = *(ulong *)(pbVar11 + -1);
          if (0xfffffffeffffffff <
              (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
               | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 |
               (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) - 0x80000000)
          {
            pbVar13 = local_23f + lVar14;
            break;
          }
          goto LAB_0012d2df;
        default:
          if ((char)bVar19 < -0x20) goto LAB_0012d2df;
          pbVar13 = local_23f + lVar14 + -8;
        }
        iVar3 = 0;
LAB_0012d28a:
        pcStack_270 = (code *)0x12d2a7;
        _ok(iVar3,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X");
        mp_nums_00 = (char (*) [16])(ulong)((byte *)pcVar18 == pbVar13);
        pcStack_270 = (code *)0x12d2cd;
        _ok((uint)((byte *)pcVar18 == pbVar13),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
        pcVar21 = pcVar21 + 1;
        pbVar11 = pbVar11 + 0x10;
        pcVar15 = pcVar15 + -1;
      } while (pcVar15 != (char *)0x0);
    }
    pcVar22 = (char *)((long)&local_247 + 1);
    builtin_strncpy(local_138 + 0xb,"of ",4);
    builtin_strncpy(local_138,"typed read ",0xb);
    pcStack_270 = (code *)0x12d32d;
    iVar3 = snprintf(local_138 + 0xe,0xf2,"%f",0xc059000000000000);
    pcVar18 = local_138 + (long)iVar3 + 0xe;
    pcStack_270 = (code *)0x12d359;
    iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
    pcStack_270 = (code *)0x12d378;
    snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",0x20);
    pcStack_270 = (code *)0x12d387;
    _space((FILE *)_stdout);
    pcStack_270 = (code *)0x12d3a0;
    fwrite("# ",2,1,_stdout);
    pcStack_270 = (code *)0x12d3b0;
    fputs(local_138,_stdout);
    pcStack_270 = (code *)0x12d3bd;
    fputc(10,_stdout);
    local_248 = 0xca;
    local_247._0_4_ = 0xc8c2;
    local_238 = 0xcb;
    local_237 = 0x59c0;
    pcVar15 = (char *)0x0;
    pcVar21 = (char *)0x0;
    do {
      pbVar11 = &local_248 + (long)pcVar15;
      bVar19 = *pbVar11;
      mVar1 = mp_type_hint[bVar19];
      if (mVar1 == MP_INT) {
        uVar9 = (ulong)(char)bVar19;
        local_260 = local_23f + (long)(pcVar15 + -8);
        switch(bVar19) {
        case 0xd0:
          local_260 = (byte *)((long)&local_247 + 1);
          uVar9 = (ulong)(char)local_23f[(long)(pcVar15 + -8)];
          goto LAB_0012d502;
        case 0xd1:
          local_260 = local_23f + (long)(pcVar15 + -6);
          uVar9 = (ulong)(short)(*(ushort *)(local_23f + (long)(pcVar15 + -8)) << 8 |
                                *(ushort *)(local_23f + (long)(pcVar15 + -8)) >> 8);
          break;
        case 0xd2:
          local_260 = local_23f + (long)(pcVar15 + -4);
          uVar4 = *(uint *)(local_23f + (long)(pcVar15 + -8));
          uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18);
          break;
        case 0xd3:
          local_260 = local_23f;
          uVar9 = *(ulong *)(local_23f + (long)(pcVar15 + -8));
          uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38;
LAB_0012d502:
          local_260 = local_260 + (long)pcVar15;
          break;
        default:
          if (0xdf < bVar19) break;
          pcStack_270 = (code *)0x12e586;
          test_mp_read_typed();
LAB_0012e586:
          pcStack_270 = (code *)0x12e58b;
          test_mp_read_typed();
LAB_0012e58b:
          pcStack_270 = (code *)0x12e590;
          test_mp_read_typed();
LAB_0012e590:
          pcStack_270 = (code *)0x12e595;
          test_mp_read_typed();
LAB_0012e595:
          pcStack_270 = (code *)0x12e59a;
          test_mp_read_typed();
          goto LAB_0012e59a;
        }
        if (uVar9 != 0xffffffffffffff9c) goto LAB_0012e611;
      }
      else {
        if (mVar1 == MP_FLOAT) {
          local_260 = local_23f + (long)(pcVar15 + -8);
          if (bVar19 == 0xca) {
            local_260 = local_23f + (long)(pcVar15 + -4);
            uVar4 = *(uint *)(local_23f + (long)(pcVar15 + -8));
            fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18);
            if ((fVar8 == -100.0) && (!NAN(fVar8))) goto LAB_0012d536;
            goto LAB_0012e607;
          }
          goto LAB_0012e6b8;
        }
        if (mVar1 == MP_UINT) goto LAB_0012e6d7;
        local_260 = local_23f + (long)(pcVar15 + -8);
        if (bVar19 != 0xcb) goto LAB_0012e5ae;
        local_260 = local_23f + (long)pcVar15;
        uVar9 = *(ulong *)(local_23f + (long)(pcVar15 + -8));
        dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
        if ((dVar6 != -100.0) || (NAN(dVar6))) goto LAB_0012e60c;
      }
LAB_0012d536:
      lVar14 = (long)pcVar21 * 0x10;
      switch(bVar19) {
      case 0xcc:
        pbVar13 = local_23f + lVar14 + -7;
        break;
      case 0xcd:
      case 0xd1:
        pbVar13 = local_23f + lVar14 + -6;
        break;
      case 0xce:
        pbVar13 = local_23f + (long)(pcVar15 + -4);
        uVar4 = *(uint *)(local_23f + (long)(pcVar15 + -8));
        uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18);
        goto LAB_0012d5bd;
      case 0xcf:
        uVar9 = *(ulong *)(local_23f + (long)(pcVar15 + -8));
        uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
        pbVar13 = local_23f + lVar14;
LAB_0012d5bd:
        if (uVar9 < 0x80000000) break;
LAB_0012d631:
        iVar3 = 1;
        pbVar13 = pbVar11;
        goto LAB_0012d5d7;
      case 0xd0:
        pbVar13 = local_23f + (long)(pcVar15 + -7);
        break;
      case 0xd2:
        pbVar13 = local_23f + lVar14 + -4;
        break;
      case 0xd3:
        uVar9 = *(ulong *)(local_23f + (long)(pcVar15 + -8));
        if (0xfffffffeffffffff <
            (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) - 0x80000000) {
          pbVar13 = local_23f + lVar14;
          break;
        }
        goto LAB_0012d631;
      default:
        if ((char)bVar19 < -0x20) goto LAB_0012d631;
        pbVar13 = local_23f + lVar14 + -8;
      }
      iVar3 = 0;
LAB_0012d5d7:
      pcStack_270 = (code *)0x12d5f8;
      _ok(iVar3,"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
      pcStack_270 = (code *)0x12d61e;
      _ok((uint)(pbVar11 == pbVar13),"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
      pcVar21 = pcVar21 + 1;
      pcVar15 = pcVar15 + 0x10;
    } while (pcVar15 == (char *)0x10);
    builtin_strncpy(local_138 + 0xb,"of ",4);
    builtin_strncpy(local_138,"typed read ",0xb);
    pcStack_270 = (code *)0x12d67a;
    iVar3 = snprintf(local_138 + 0xe,0xf2,"%lf",0x3ff3c083126e978d);
    pcVar18 = local_138 + (long)iVar3 + 0xe;
    pcStack_270 = (code *)0x12d6a6;
    iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
    pcStack_270 = (code *)0x12d6c5;
    snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",0x20);
    pcStack_270 = (code *)0x12d6d4;
    _space((FILE *)_stdout);
    pcStack_270 = (code *)0x12d6ed;
    fwrite("# ",2,1,_stdout);
    pcStack_270 = (code *)0x12d6fd;
    fputs(local_138,_stdout);
    pcStack_270 = (code *)0x12d70a;
    fputc(10,_stdout);
    if (local_254 == MP_UINT) goto LAB_0012e670;
    if (local_254 != MP_FLOAT) {
      if (local_254 != MP_INT) {
        pcStack_270 = (code *)0x12d758;
        _ok(1,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",0xffffffcb);
        pcStack_270 = (code *)0x12d77a;
        _ok(1,"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
        builtin_strncpy(local_138 + 0x13,"eading ",8);
        builtin_strncpy(local_138,"ensure failure of r",0x13);
        pcStack_270 = (code *)0x12d7b0;
        snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x20);
        pcStack_270 = (code *)0x12d7bf;
        _space((FILE *)_stdout);
        pcStack_270 = (code *)0x12d7d8;
        fwrite("# ",2,1,_stdout);
        pcStack_270 = (code *)0x12d7e8;
        fputs(local_138,_stdout);
        pcStack_270 = (code *)0x12d7f5;
        fputc(10,_stdout);
        local_248 = 0x91;
        local_238 = 0x81;
        local_228 = 0xa3;
        local_227 = 0x6261;
        local_225 = 99;
        local_218 = 0xc3;
        if (local_261 == '\0') {
          puVar5 = &local_206;
          local_208 = 0x3c7;
        }
        else {
          puVar5 = (undefined1 *)((long)&local_208 + 1);
          local_208 = CONCAT11(local_208._1_1_,local_261);
        }
        *puVar5 = 1;
        puVar5[3] = 99;
        *(undefined2 *)(puVar5 + 1) = 0x6261;
        local_1f8 = 0x626103c4;
        local_1f4 = 99;
        local_1e8 = 0xc0;
        lVar14 = 7;
        lVar20 = 0;
        do {
          lVar10 = lVar20 * 0x10;
          bVar19 = ((byte *)pcVar22)[-2];
          switch(bVar19) {
          case 0xcc:
            pbVar11 = local_23f + lVar10 + -7;
            break;
          case 0xcd:
          case 0xd1:
            pbVar11 = local_23f + lVar10 + -6;
            break;
          case 0xce:
            uVar4 = *(uint *)((byte *)pcVar22 + -1);
            uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18);
            pbVar11 = (byte *)pcVar22 + 3;
            goto LAB_0012d8e5;
          case 0xcf:
            uVar9 = *(ulong *)((byte *)pcVar22 + -1);
            uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                    (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                    (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                    (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            pbVar11 = local_23f + lVar10;
LAB_0012d8e5:
            if (uVar9 < 0x80000000) break;
LAB_0012d974:
            iVar3 = 1;
            pbVar11 = (byte *)pcVar22 + -2;
            goto LAB_0012d90a;
          case 0xd0:
            pbVar11 = (byte *)pcVar22;
            break;
          case 0xd2:
            pbVar11 = local_23f + lVar10 + -4;
            break;
          case 0xd3:
            uVar9 = *(ulong *)((byte *)pcVar22 + -1);
            if (0xfffffffeffffffff <
                (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                 (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                 (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38) - 0x80000000) {
              pbVar11 = local_23f + lVar10;
              break;
            }
            goto LAB_0012d974;
          default:
            if ((char)bVar19 < -0x20) goto LAB_0012d974;
            pbVar11 = local_23f + lVar10 + -8;
          }
          iVar3 = 0;
LAB_0012d90a:
          pcStack_270 = (code *)0x12d934;
          local_250 = (byte *)pcVar22;
          _ok(iVar3,"rc == -1",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
          pcVar18 = "pos == bad_types[i]";
          pcStack_270 = (code *)0x12d95d;
          _ok((uint)((byte *)pcVar22 + -2 == pbVar11),"pos == bad_types[i]",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
          lVar20 = lVar20 + 1;
          pcVar22 = (char *)(local_250 + 0x10);
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        pcStack_270 = (code *)0x12d995;
        test_read_num<long,int,int(*)(char_const**,long*)>
                  (0x7b,(_func_int_char_ptr_ptr_long_ptr *)pcVar18,is_ok_18);
        pcStack_270 = (code *)0x12d99f;
        test_read_num<long,int,int(*)(char_const**,long*)>
                  (0x3039,(_func_int_char_ptr_ptr_long_ptr *)pcVar18,is_ok_19);
        pcStack_270 = (code *)0x12d9a9;
        test_read_num<long,int,int(*)(char_const**,long*)>
                  (0x75bcd15,(_func_int_char_ptr_ptr_long_ptr *)pcVar18,is_ok_20);
        pcStack_270 = (code *)0x12d9b7;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
                  (0x7fffffffffffffff,(_func_int_char_ptr_ptr_long_ptr *)0x1,is_ok_21);
        read_f_00 = (_func_int_char_ptr_ptr_long_ptr *)0x0;
        pcStack_270 = (code *)0x12d9c2;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
                  (0x8000000000000000,(_func_int_char_ptr_ptr_long_ptr *)0x0,is_ok_22);
        pcStack_270 = (code *)0x12d9cc;
        test_read_num<long,int,int(*)(char_const**,long*)>(-0x7b,read_f_00,is_ok_23);
        pcStack_270 = (code *)0x12d9d6;
        test_read_num<long,int,int(*)(char_const**,long*)>(-0x3039,read_f_00,is_ok_24);
        pcStack_270 = (code *)0x12d9e0;
        test_read_num<long,int,int(*)(char_const**,long*)>(-0x75bcd15,read_f_00,is_ok_25);
        builtin_strncpy(local_138 + 0xb,"of ",4);
        builtin_strncpy(local_138,"typed read ",0xb);
        pcStack_270 = (code *)0x12da1a;
        iVar3 = snprintf(local_138 + 0xe,0xf2,"%lld",0x8000000000000001);
        pcVar18 = local_138 + (long)iVar3 + 0xe;
        pcStack_270 = (code *)0x12da46;
        iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
        pcStack_270 = (code *)0x12da65;
        snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"int%zu_t",0x40);
        pcStack_270 = (code *)0x12da74;
        _space((FILE *)_stdout);
        local_148 = 1;
        pcStack_270 = (code *)0x12da9a;
        fwrite("# ",2,1,_stdout);
        pcStack_270 = (code *)0x12daaa;
        fputs(local_138,_stdout);
        pcStack_270 = (code *)0x12dab7;
        fputc(10,_stdout);
        pcVar18 = (char *)&local_248;
        pcStack_270 = (code *)0x12dac7;
        uVar4 = test_encode_int_all_sizes((char (*) [16])pcVar18,-0x7fffffffffffffff);
        if (0 < (int)uVar4) {
          pbVar13 = (byte *)(ulong)uVar4;
          pbVar11 = &local_248;
          lVar14 = 0;
          do {
            lVar20 = lVar14 * 0x10;
            bVar19 = *pbVar11;
            mVar1 = mp_type_hint[bVar19];
            if (mVar1 == MP_UINT) {
              switch(bVar19) {
              case 0xcc:
                pbVar12 = pbVar11 + 2;
                break;
              case 0xcd:
                pbVar12 = local_23f + lVar20 + -6;
                break;
              case 0xce:
                pbVar12 = local_23f + lVar20 + -4;
                break;
              case 0xcf:
                pbVar12 = local_23f + lVar20;
                bVar23 = *(long *)(pbVar11 + 1) == 0x100000000000080;
                goto LAB_0012dc15;
              default:
                if ((char)bVar19 < '\0') goto LAB_0012e5a9;
                pbVar12 = local_23f + lVar20 + -8;
              }
              bVar23 = false;
LAB_0012dc15:
              if (!bVar23) goto LAB_0012e66b;
            }
            else if (mVar1 == MP_FLOAT) {
              if (bVar19 != 0xca) goto LAB_0012e6b8;
              uVar4 = *(uint *)(pbVar11 + 1);
              fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18);
              if ((fVar8 != -9.223372e+18) || (NAN(fVar8))) goto LAB_0012e65c;
              pbVar12 = local_23f + lVar20 + -4;
            }
            else {
              if (mVar1 != MP_INT) {
                if (bVar19 == 0xcb) {
                  uVar9 = *(ulong *)(pbVar11 + 1);
                  dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                                   (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                                   (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                                   (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
                  if ((dVar6 == -9.223372036854776e+18) && (!NAN(dVar6))) {
                    pbVar12 = pbVar11 + 9;
                    goto LAB_0012dc34;
                  }
                  goto LAB_0012e661;
                }
                goto LAB_0012e5ae;
              }
              switch(bVar19) {
              case 0xd0:
                pbVar12 = pbVar11 + 2;
                break;
              case 0xd1:
                pbVar12 = local_23f + lVar20 + -6;
                break;
              case 0xd2:
                pbVar12 = local_23f + lVar20 + -4;
                break;
              case 0xd3:
                pbVar12 = local_23f + lVar20;
                bVar23 = *(long *)(pbVar11 + 1) == 0x100000000000080;
                goto LAB_0012dc2c;
              default:
                if (bVar19 < 0xe0) goto LAB_0012e5a4;
                pbVar12 = local_23f + lVar20 + -8;
              }
              bVar23 = false;
LAB_0012dc2c:
              if (!bVar23) goto LAB_0012e666;
            }
LAB_0012dc34:
            uVar9 = (ulong)(char)bVar19;
            local_140 = pbVar12;
            switch(bVar19) {
            case 0xcc:
              uVar9 = (ulong)pbVar11[1];
              goto LAB_0012dc78;
            case 0xcd:
              pbVar12 = local_23f + lVar20 + -6;
              uVar9 = (ulong)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8)
              ;
              break;
            case 0xce:
              uVar4 = *(uint *)(pbVar11 + 1);
              uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18);
              pbVar12 = local_23f + lVar20 + -4;
              break;
            case 0xcf:
              uVar9 = *(ulong *)(pbVar11 + 1);
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
              if (-1 < (long)uVar9) goto LAB_0012dca3;
LAB_0012dd89:
              uVar9 = 0;
              iVar3 = 0;
              pbVar12 = pbVar11;
              goto LAB_0012dcee;
            case 0xd0:
              uVar9 = (ulong)(char)pbVar11[1];
LAB_0012dc78:
              pbVar12 = local_23f + lVar20 + -7;
              break;
            case 0xd1:
              pbVar12 = local_23f + lVar20 + -6;
              uVar9 = (ulong)(short)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
              break;
            case 0xd2:
              uVar4 = *(uint *)(pbVar11 + 1);
              pbVar12 = local_23f + lVar20 + -4;
              uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                  uVar4 << 0x18);
              break;
            case 0xd3:
              uVar9 = *(ulong *)(pbVar11 + 1);
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
LAB_0012dca3:
              pbVar12 = local_23f + lVar20;
              break;
            default:
              if ((char)bVar19 < -0x20) goto LAB_0012dd89;
              pbVar12 = local_23f + lVar20 + -8;
            }
            iVar3 = 1;
LAB_0012dcee:
            pcStack_270 = (code *)0x12dd0b;
            local_250 = pbVar13;
            _ok(iVar3,"rc == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
            pcStack_270 = (code *)0x12dd36;
            _ok((uint)(local_140 == pbVar12),"mp_num_pos1 == mp_num_pos2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x73c,"check position");
            pbVar13 = local_250;
            if (-1 < (long)uVar9) goto LAB_0012e602;
            pcStack_270 = (code *)0x12dd74;
            _ok((uint)(uVar9 == 0x8000000000000001),"(int64_t)num1 == (int64_t)num2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x746,"check int number");
            lVar14 = lVar14 + 1;
            pbVar11 = pbVar11 + 0x10;
            pbVar13 = pbVar13 + -1;
          } while (pbVar13 != (byte *)0x0);
        }
        builtin_strncpy(local_138 + 0xb,"of ",4);
        builtin_strncpy(local_138,"typed read ",0xb);
        pcStack_270 = (code *)0x12ddd5;
        iVar3 = snprintf(local_138 + 0xe,0xf2,"%f",0x4059000000000000);
        pcVar22 = local_138 + (long)iVar3 + 0xe;
        pcStack_270 = (code *)0x12de01;
        iVar3 = snprintf(pcVar22,(size_t)(local_38 + -(long)pcVar22)," into ");
        pcStack_270 = (code *)0x12de20;
        snprintf(pcVar22 + iVar3,(size_t)(local_38 + -(long)(pcVar22 + iVar3)),"int%zu_t",0x40);
        pcStack_270 = (code *)0x12de2f;
        _space((FILE *)_stdout);
        pcStack_270 = (code *)0x12de48;
        fwrite("# ",2,1,_stdout);
        pcStack_270 = (code *)0x12de58;
        fputs(local_138,_stdout);
        pcStack_270 = (code *)0x12de65;
        fputc(10,_stdout);
        local_248 = 0xca;
        local_247._0_4_ = 0xc842;
        local_238 = 0xcb;
        local_237 = 0x5940;
        pcVar15 = "check position";
        pbVar13 = (byte *)0x0;
        do {
          bVar19 = *pcVar18;
          uVar9 = (ulong)bVar19;
          mVar1 = mp_type_hint[uVar9];
          if (mVar1 == MP_UINT) {
            switch(bVar19) {
            case 0xcc:
              uVar9 = (ulong)(byte)pcVar18[1];
              break;
            case 0xcd:
              uVar9 = (ulong)(ushort)(*(ushort *)(pcVar18 + 1) << 8 | *(ushort *)(pcVar18 + 1) >> 8)
              ;
              break;
            case 0xce:
              uVar4 = *(uint *)(pcVar18 + 1);
              uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18);
              break;
            case 0xcf:
              uVar9 = *(ulong *)(pcVar18 + 1);
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
              break;
            default:
              if ((char)bVar19 < '\0') goto LAB_0012e59a;
            }
            if (uVar9 != 100) goto LAB_0012e648;
          }
          else if (mVar1 == MP_FLOAT) {
            if (bVar19 != 0xca) goto LAB_0012e6b8;
            uVar4 = *(uint *)(pcVar18 + 1);
            fVar8 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18);
            if ((fVar8 != 100.0) || (NAN(fVar8))) goto LAB_0012e643;
          }
          else if (mVar1 == MP_INT) {
            uVar9 = (ulong)(char)bVar19;
            switch(bVar19) {
            case 0xd0:
              uVar9 = (ulong)pcVar18[1];
              break;
            case 0xd1:
              uVar9 = (ulong)(short)(*(ushort *)(pcVar18 + 1) << 8 | *(ushort *)(pcVar18 + 1) >> 8);
              break;
            case 0xd2:
              uVar4 = *(uint *)(pcVar18 + 1);
              uVar9 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                  uVar4 << 0x18);
              break;
            case 0xd3:
              uVar9 = *(ulong *)(pcVar18 + 1);
              uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
              break;
            default:
              if (bVar19 < 0xe0) goto LAB_0012e59f;
            }
            if (uVar9 != 100) goto LAB_0012e64d;
          }
          else {
            if (bVar19 != 0xcb) goto LAB_0012e5ae;
            uVar9 = *(ulong *)(pcVar18 + 1);
            dVar6 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                             (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                             (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
            if ((dVar6 != 100.0) || (NAN(dVar6))) goto LAB_0012e63e;
          }
          if (bVar19 - 0xcc < 8) {
            lVar14 = (long)pbVar13 * 0x10;
            switch((uint)bVar19) {
            default:
              pcVar21 = (char *)(local_23f + lVar14 + -7);
              break;
            case 0xcd:
            case 0xd1:
              pcVar21 = (char *)(local_23f + lVar14 + -6);
              break;
            case 0xce:
            case 0xd2:
              pcVar21 = (char *)(local_23f + lVar14 + -4);
              break;
            case 0xcf:
              bVar23 = SUB41(((uint)*(ulong *)(pcVar18 + 1) & 0x80) >> 7,0);
              pcVar21 = pcVar18 + (ulong)((*(ulong *)(pcVar18 + 1) & 0x80) == 0) * 9;
              goto LAB_0012e02f;
            case 0xd3:
              pcVar21 = (char *)(local_23f + lVar14);
            }
            bVar23 = false;
          }
          else {
            bVar23 = (char)bVar19 < -0x20;
            pcVar21 = pcVar18 + 1;
            if ((char)bVar19 < -0x20) {
              pcVar21 = pcVar18;
            }
          }
LAB_0012e02f:
          pcStack_270 = (code *)0x12e053;
          _ok((uint)bVar23,"rc == -1",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
          pcStack_270 = (code *)0x12e075;
          _ok((uint)(pcVar18 == pcVar21),"mp_num_pos2 == mp_nums[i]",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x738,"check position");
          pbVar13 = pbVar13 + 1;
          pcVar18 = pcVar18 + 0x10;
          local_148 = local_148 + -1;
        } while (local_148 == 0);
        builtin_strncpy(local_138 + 0xb,"of ",4);
        builtin_strncpy(local_138,"typed read ",0xb);
        pcStack_270 = (code *)0x12e0da;
        iVar3 = snprintf(local_138 + 0xe,0xf2,"%lf",0xc015ba786c22680a);
        pcVar18 = local_138 + (long)iVar3 + 0xe;
        pcStack_270 = (code *)0x12e106;
        iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
        pcVar22 = (char *)(local_38 + -(long)(pcVar18 + iVar3));
        pcStack_270 = (code *)0x12e125;
        snprintf(pcVar18 + iVar3,(size_t)pcVar22,"int%zu_t",0x40);
        pcStack_270 = (code *)0x12e134;
        _space((FILE *)_stdout);
        pcStack_270 = (code *)0x12e14d;
        fwrite("# ",2,1,_stdout);
        pcStack_270 = (code *)0x12e15d;
        fputs(local_138,_stdout);
        pcStack_270 = (code *)0x12e16a;
        fputc(10,_stdout);
        local_260 = (byte *)&local_247;
        local_248 = 0xcb;
        local_247._0_1_ = -0x40;
        local_247._1_1_ = '\x15';
        local_247._2_1_ = -0x46;
        local_247._3_1_ = 'x';
        local_247._4_1_ = 'l';
        local_247._5_1_ = '\"';
        local_247._6_1_ = 'h';
        local_247._7_1_ = '\n';
        pbVar11 = &local_248;
        if (local_254 != MP_INT) {
          if (local_254 != MP_FLOAT) {
            if (local_254 == MP_UINT) {
LAB_0012e6d7:
              pcVar18 = 
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ;
              mp_nums_00 = (char (*) [16])&local_260;
              pcStack_270 = (code *)0x12e6e1;
              local_260 = pbVar11;
              mp_decode_uint((char **)mp_nums_00);
LAB_0012e6e1:
              pcStack_270 = (code *)0x12e6e6;
              test_mp_read_typed();
LAB_0012e6e6:
              pcStack_270 = test_next_on_array;
              test_mp_read_typed();
              pbStack_298 = pbVar11;
              pcStack_290 = pcVar21;
              pbStack_288 = pbVar13;
              pbStack_280 = (byte *)pcVar22;
              pbStack_278 = (byte *)pcVar18;
              pcStack_270 = (code *)pcVar15;
              _space((FILE *)_stdout);
              fwrite("# ",2,1,_stdout);
              uVar4 = (uint)mp_nums_00;
              fprintf(_stdout,"next/check on array(%u)",(ulong)mp_nums_00 & 0xffffffff);
              fputc(10,_stdout);
              if (uVar4 < 0x10) {
                buf[1] = (byte)mp_nums_00 | 0x90;
                pcVar18 = buf + 2;
              }
              else if (uVar4 < 0x10000) {
                buf[1] = -0x24;
                uVar2 = (ushort)mp_nums_00 << 8 | (ushort)mp_nums_00 >> 8;
                buf[2] = (char)uVar2;
                buf[3] = (char)(uVar2 >> 8);
                pcVar18 = buf + 4;
              }
              else {
                buf[1] = -0x23;
                buf._2_4_ = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                pcVar18 = buf + 6;
              }
              if (uVar4 != 0) {
                uVar9 = 0;
                uVar7 = (ulong)mp_nums_00 & 0xffffffff;
                do {
                  iVar3 = (int)(uVar9 * 0x2040811 >> 0x20);
                  uVar17 = ((uint)((int)uVar9 - iVar3) >> 1) + iVar3 >> 6;
                  *pcVar18 = (char)uVar9 - ((char)(uVar17 << 7) - (char)uVar17);
                  pcVar18 = pcVar18 + 1;
                  uVar9 = (ulong)((int)uVar9 + 1);
                  uVar17 = (int)uVar7 - 1;
                  uVar7 = (ulong)uVar17;
                } while (uVar17 != 0);
              }
              iVar3 = 1;
              if (0xf < uVar4) {
                iVar3 = (0xffff < uVar4) + 3 + (uint)(0xffff < uVar4);
              }
              uVar4 = iVar3 + uVar4;
              pbVar11 = (byte *)(ulong)uVar4;
              pcStack_2a0 = buf + 1;
              pbStack_2a8 = (byte *)(buf + 1);
              iVar3 = mp_check(&pcStack_2a0,::str);
              _ok((uint)(iVar3 == 0),"!mp_check(&d2, data + BUF_MAXLEN)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x2a9,"mp_check(array %u))",(ulong)mp_nums_00 & 0xffffffff);
              _ok((uint)((byte *)(pcVar18 + -0x154121) == pbVar11),"(d1 - data) == (ptrdiff_t)len",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x2aa,"len(array %u) == %u",(ulong)mp_nums_00 & 0xffffffff,uVar4);
              _ok((uint)((byte *)(pcStack_2a0 + -0x154121) == pbVar11),
                  "(d2 - data) == (ptrdiff_t)len",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x2ab,"len(mp_check(array %u)) == %u",(ulong)mp_nums_00 & 0xffffffff,uVar4);
              lVar14 = 1;
              do {
                lVar20 = (long)""[*pbStack_2a8];
                if (lVar20 < 0) {
                  if (*pbStack_2a8 == 0xd9) {
                    pbStack_2a8 = pbStack_2a8 + (ulong)pbStack_2a8[1] + 2;
                    goto LAB_0012e8d8;
                  }
                  if (-0x20 < ""[*pbStack_2a8]) {
                    lVar14 = lVar14 - lVar20;
                    pbStack_2a8 = pbStack_2a8 + 1;
                    goto LAB_0012e8d8;
                  }
                  mp_next_slowpath((char **)&pbStack_2a8,lVar14);
                  bVar23 = false;
                  lVar20 = lVar14;
                }
                else {
                  pbStack_2a8 = pbStack_2a8 + 1 + lVar20;
LAB_0012e8d8:
                  bVar23 = true;
                  lVar20 = lVar14;
                }
                if ((!bVar23) || (lVar14 = lVar20 + -1, lVar20 < 2)) {
                  _ok((uint)(pbStack_2a8 + -0x154121 == pbVar11),"(d3 - data) == (ptrdiff_t)len",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x2ad,"len(mp_next(array %u)) == %u",(ulong)mp_nums_00 & 0xffffffff,uVar4);
                  return extraout_EAX_00;
                }
              } while( true );
            }
            local_260 = local_23f;
            pcStack_270 = (code *)0x12e1e2;
            _ok(1,"rc == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x737,"check failure for code 0x%02X",0xffffffcb);
            pcStack_270 = (code *)0x12e204;
            _ok(1,"mp_num_pos2 == mp_nums[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x738,"check position");
            builtin_strncpy(local_138 + 0x13,"eading ",8);
            builtin_strncpy(local_138,"ensure failure of r",0x13);
            pcStack_270 = (code *)0x12e23a;
            snprintf(local_138 + 0x1a,0xe6,"int%zu_t",0x40);
            pcStack_270 = (code *)0x12e249;
            _space((FILE *)_stdout);
            pcStack_270 = (code *)0x12e262;
            fwrite("# ",2,1,_stdout);
            pcStack_270 = (code *)0x12e272;
            fputs(local_138,_stdout);
            pcStack_270 = (code *)0x12e27f;
            fputc(10,_stdout);
            local_248 = 0x91;
            local_238 = 0x81;
            local_228 = 0xa3;
            local_227 = 0x6261;
            local_225 = 99;
            local_218 = 0xc3;
            if (local_261 == '\0') {
              puVar5 = &local_206;
              local_208 = 0x3c7;
            }
            else {
              puVar5 = (undefined1 *)((long)&local_208 + 1);
              local_208 = CONCAT11(local_208._1_1_,local_261);
            }
            *puVar5 = 1;
            puVar5[3] = 99;
            *(undefined2 *)(puVar5 + 1) = 0x6261;
            local_1f8 = 0x626103c4;
            local_1f4 = 99;
            local_1e8 = 0xc0;
            lVar20 = 7;
            lVar14 = 0;
            do {
              bVar19 = *pbVar11;
              if (bVar19 - 0xcc < 8) {
                lVar10 = lVar14 * 0x10;
                switch((uint)bVar19) {
                default:
                  pbVar13 = local_23f + lVar10 + -7;
                  break;
                case 0xcd:
                case 0xd1:
                  pbVar13 = local_23f + lVar10 + -6;
                  break;
                case 0xce:
                case 0xd2:
                  pbVar13 = local_23f + lVar10 + -4;
                  break;
                case 0xcf:
                  bVar23 = SUB41(((uint)*(ulong *)(pbVar11 + 1) & 0x80) >> 7,0);
                  pbVar13 = pbVar11 + (ulong)((*(ulong *)(pbVar11 + 1) & 0x80) == 0) * 9;
                  goto LAB_0012e35a;
                case 0xd3:
                  pbVar13 = local_23f + lVar10;
                }
                bVar23 = false;
              }
              else {
                bVar23 = (char)bVar19 < -0x20;
                pbVar13 = pbVar11 + 1;
                if ((char)bVar19 < -0x20) {
                  pbVar13 = pbVar11;
                }
              }
LAB_0012e35a:
              pcStack_270 = (code *)0x12e380;
              _ok((uint)bVar23,"rc == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
              pcStack_270 = (code *)0x12e3a9;
              _ok((uint)(pbVar11 == pbVar13),"pos == bad_types[i]",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x76e,"check position for code 0x%02X",(ulong)(uint)(int)(char)bVar19);
              lVar14 = lVar14 + 1;
              pbVar11 = pbVar11 + 0x10;
              lVar20 = lVar20 + -1;
              if (lVar20 == 0) {
                pcStack_270 = (code *)0x12e3de;
                test_read_num<double,int,int(*)(char_const**,double*)>(0x7b,mp_read_double,is_ok_26)
                ;
                pcStack_270 = (code *)0x12e3eb;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (0x3039,mp_read_double,is_ok_27);
                pcStack_270 = (code *)0x12e3f8;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (0x75bcd15,mp_read_double,is_ok_28);
                pcStack_270 = (code *)0x12e412;
                test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                          (0x11f71fb0450,mp_read_double,true);
                pcStack_270 = (code *)0x12e429;
                test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                          (0x1b69b4bacd05f15,mp_read_double,false);
                pcStack_270 = (code *)0x12e436;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x7b,mp_read_double,is_ok_29);
                pcStack_270 = (code *)0x12e443;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x3039,mp_read_double,is_ok_30);
                pcStack_270 = (code *)0x12e450;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x75bcd15,mp_read_double,is_ok_31);
                pcStack_270 = (code *)0x12e46a;
                test_read_num<double,long_long,int(*)(char_const**,double*)>
                          (-0x11f71fb0450,mp_read_double,true);
                uVar16 = 0x18;
                pcStack_270 = (code *)0x12e481;
                test_read_num<double,long_long,int(*)(char_const**,double*)>
                          (-0x1b69b4bacd05f15,mp_read_double,false);
                pcStack_270 = (code *)0x12e489;
                test_read_num<double,float,int(*)(char_const**,double*)>
                          (num1,mp_read_double,(bool)uVar16);
                pcStack_270 = (code *)0x12e491;
                test_read_num<double,double,int(*)(char_const**,double*)>
                          (num1_01,mp_read_double,(bool)uVar16);
                pcStack_270 = (code *)0x12e499;
                test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>
                          (mp_read_double);
                pcStack_270 = (code *)0x12e4ad;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (0x7b,mp_read_double_lossy,is_ok_32);
                pcStack_270 = (code *)0x12e4ba;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (0x3039,mp_read_double_lossy,is_ok_33);
                pcStack_270 = (code *)0x12e4c7;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (0x75bcd15,mp_read_double_lossy,is_ok_34);
                pcStack_270 = (code *)0x12e4d7;
                test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                          (0x11f71fb0450,mp_read_double_lossy,true);
                pcStack_270 = (code *)0x12e4e7;
                test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
                          (0x1b69b4bacd05f15,mp_read_double_lossy,true);
                pcStack_270 = (code *)0x12e4f4;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x7b,mp_read_double_lossy,is_ok_35);
                pcStack_270 = (code *)0x12e501;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x3039,mp_read_double_lossy,is_ok_36);
                pcStack_270 = (code *)0x12e50e;
                test_read_num<double,int,int(*)(char_const**,double*)>
                          (-0x75bcd15,mp_read_double_lossy,is_ok_37);
                pcStack_270 = (code *)0x12e51e;
                test_read_num<double,long_long,int(*)(char_const**,double*)>
                          (-0x11f71fb0450,mp_read_double_lossy,true);
                uVar16 = 0x5e;
                pcStack_270 = (code *)0x12e52e;
                test_read_num<double,long_long,int(*)(char_const**,double*)>
                          (-0x1b69b4bacd05f15,mp_read_double_lossy,true);
                pcStack_270 = (code *)0x12e536;
                test_read_num<double,float,int(*)(char_const**,double*)>
                          (num1_00,mp_read_double_lossy,(bool)uVar16);
                pcStack_270 = (code *)0x12e53e;
                test_read_num<double,double,int(*)(char_const**,double*)>
                          (num1_02,mp_read_double_lossy,(bool)uVar16);
                pcStack_270 = (code *)0x12e546;
                test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>
                          (mp_read_double_lossy);
                pcStack_270 = (code *)0x12e555;
                _space((FILE *)_stdout);
                pcStack_270 = (code *)0x12e56a;
                printf("# *** %s: done ***\n","test_mp_read_typed");
                pcStack_270 = (code *)0x12e56f;
                iVar3 = check_plan();
                return iVar3;
              }
            } while( true );
          }
          goto LAB_0012e6b8;
        }
      }
LAB_0012e694:
      pcStack_270 = (code *)0x12e6b3;
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x933,"int64_t mp_decode_int(const char **)");
    }
LAB_0012e6b8:
    pcStack_270 = (code *)0x12e6d7;
    __assert_fail("c == 0xca",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x97e,"float mp_decode_float(const char **)");
  }
  goto LAB_0012e670;
LAB_0012e59a:
  pcStack_270 = (code *)0x12e59f;
  test_mp_read_typed();
LAB_0012e59f:
  pcStack_270 = (code *)0x12e5a4;
  test_mp_read_typed();
LAB_0012e5a4:
  pcStack_270 = (code *)0x12e5a9;
  test_mp_read_typed();
LAB_0012e5a9:
  pcStack_270 = (code *)0x12e5ae;
  test_mp_read_typed();
LAB_0012e5ae:
  pcStack_270 = (code *)0x12e5cd;
  __assert_fail("c == 0xcb",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x987,"double mp_decode_double(const char **)");
LAB_0012e602:
  pcStack_270 = (code *)0x12e607;
  test_mp_read_typed();
LAB_0012e607:
  pcStack_270 = (code *)0x12e60c;
  test_mp_read_typed();
LAB_0012e60c:
  pcStack_270 = (code *)0x12e611;
  test_mp_read_typed();
LAB_0012e611:
  pcStack_270 = (code *)0x12e616;
  test_mp_read_typed();
LAB_0012e616:
  pcStack_270 = (code *)0x12e61b;
  test_mp_read_typed();
LAB_0012e61b:
  pcStack_270 = (code *)0x12e620;
  test_mp_read_typed();
LAB_0012e620:
  pcStack_270 = (code *)0x12e625;
  test_mp_read_typed();
LAB_0012e625:
  pcStack_270 = (code *)0x12e62a;
  test_mp_read_typed();
LAB_0012e62a:
  pcStack_270 = (code *)0x12e62f;
  test_mp_read_typed();
LAB_0012e62f:
  pcStack_270 = (code *)0x12e634;
  test_mp_read_typed();
LAB_0012e634:
  pcStack_270 = (code *)0x12e639;
  test_mp_read_typed();
LAB_0012e639:
  pcStack_270 = (code *)0x12e63e;
  test_mp_read_typed();
LAB_0012e63e:
  pcStack_270 = (code *)0x12e643;
  test_mp_read_typed();
LAB_0012e643:
  pcStack_270 = (code *)0x12e648;
  test_mp_read_typed();
LAB_0012e648:
  pcStack_270 = (code *)0x12e64d;
  test_mp_read_typed();
LAB_0012e64d:
  pcStack_270 = (code *)0x12e652;
  test_mp_read_typed();
LAB_0012e652:
  pcStack_270 = (code *)0x12e657;
  test_mp_read_typed();
LAB_0012e657:
  pcStack_270 = (code *)0x12e65c;
  test_mp_read_typed();
LAB_0012e65c:
  pcStack_270 = (code *)0x12e661;
  test_mp_read_typed();
LAB_0012e661:
  pcStack_270 = (code *)0x12e666;
  test_mp_read_typed();
LAB_0012e666:
  pcStack_270 = (code *)0x12e66b;
  test_mp_read_typed();
LAB_0012e66b:
  pcStack_270 = (code *)0x12e670;
  test_mp_read_typed();
LAB_0012e670:
  pcStack_270 = (code *)0x12e68f;
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x8f7,"uint64_t mp_decode_uint_data(uint8_t, const char **)");
}

Assistant:

static int
test_mp_read_typed()
{
	plan(716);
	header();

	test_read_int8(12, true);
	test_read_int8(127, true);
	test_read_int8(128, false);
	test_read_int8(-12, true);
	test_read_int8(-128, true);
	test_read_int8(-129, false);
	test_read_int8(-3e-4f, false);
	test_read_int8(123.45, false);
	test_read_num_from_non_numeric_mp<int8_t>(mp_read_int8);

	test_read_int16(123, true);
	test_read_int16(32767, true);
	test_read_int16(32768, false);
	test_read_int16(-123, true);
	test_read_int16(-32768, true);
	test_read_int16(-32769, false);
	test_read_int16(-2e-3f, false);
	test_read_int16(12.345, false);
	test_read_num_from_non_numeric_mp<int16_t>(mp_read_int16);

	test_read_int32(123, true);
	test_read_int32(12345, true);
	test_read_int32(2147483647, true);
	test_read_int32(2147483648, false);
	test_read_int32(-123, true);
	test_read_int32(-12345, true);
	test_read_int32(-2147483648, true);
	test_read_int32(-2147483649LL, false);
	test_read_int32(-1e2f, false);
	test_read_int32(1.2345, false);
	test_read_num_from_non_numeric_mp<int32_t>(mp_read_int32);

	test_read_int64(123, true);
	test_read_int64(12345, true);
	test_read_int64(123456789, true);
	test_read_int64(9223372036854775807ULL, true);
	test_read_int64(9223372036854775808ULL, false);
	test_read_int64(-123, true);
	test_read_int64(-12345, true);
	test_read_int64(-123456789, true);
	test_read_int64(-9223372036854775807LL, true);
	test_read_int64(100.0f, false);
	test_read_int64(-5.4321, false);
	test_read_num_from_non_numeric_mp<int64_t>(mp_read_int64);

	test_read_double(123, true);
	test_read_double(12345, true);
	test_read_double(123456789, true);
	test_read_double(1234567890000ULL, true);
	test_read_double(123456789123456789ULL, false);
	test_read_double(-123, true);
	test_read_double(-12345, true);
	test_read_double(-123456789, true);
	test_read_double(-1234567890000LL, true);
	test_read_double(-123456789123456789LL, false);
	test_read_double(6.565e6f, true);
	test_read_double(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double);

	test_read_double_lossy(123, true);
	test_read_double_lossy(12345, true);
	test_read_double_lossy(123456789, true);
	test_read_double_lossy(1234567890000ULL, true);
	test_read_double_lossy(123456789123456789ULL, true);
	test_read_double_lossy(-123, true);
	test_read_double_lossy(-12345, true);
	test_read_double_lossy(-123456789, true);
	test_read_double_lossy(-1234567890000LL, true);
	test_read_double_lossy(-123456789123456789LL, true);
	test_read_double_lossy(6.565e6f, true);
	test_read_double_lossy(-5.555, true);
	test_read_num_from_non_numeric_mp<double>(mp_read_double_lossy);

	footer();
	return check_plan();
}